

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

int __thiscall HighFreqSub::registerDataType(HighFreqSub *this,HighFreqDataType *hf)

{
  int iVar1;
  zsock_t *pzVar2;
  char *__s1;
  string local_40;
  
  std::__cxx11::string::_M_assign((string *)&(this->dt).name);
  std::__cxx11::string::_M_assign((string *)&(this->dt).origin);
  std::__cxx11::string::_M_assign((string *)&(this->dt).dataFormat);
  std::__cxx11::string::_M_assign((string *)&(this->dt).sockAddr);
  (this->dt).byteSize = hf->byteSize;
  HighFreqDataType::getSockAddr_abi_cxx11_(&local_40,&this->dt);
  pzVar2 = zsock_new_sub_checked
                     (local_40._M_dataplus._M_p,"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                      ,0x53);
  this->sub = pzVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (this->sub == (zsock_t *)0x0) {
    iVar1 = -1;
  }
  else {
    zsock_set_rcvhwm(this->sub,100);
    if (this->actor == (zactor_t *)0x0) {
      iVar1 = 0;
    }
    else {
      zstr_send(this->actor,"$REG");
      __s1 = zstr_recv(this->actor);
      iVar1 = strcmp(__s1,"$REGD");
      free(__s1);
      iVar1 = -(uint)(iVar1 != 0);
    }
  }
  return iVar1;
}

Assistant:

int HighFreqSub::registerDataType(HighFreqDataType hf){
    dt = hf;
    sub = zsock_new_sub(dt.getSockAddr().c_str(), "");
    if(!sub){
        return -1;
    }
//    registered = true;
    zsock_set_rcvhwm(sub, 100);
    if(actor){
        zstr_send(actor, regdt);
        char *recv = zstr_recv(actor);
        if(streq(recv, regdone)){
            freen(recv);
            return 0;
        }else{
            freen(recv);
            return -1;
        }
    }
    return 0;
}